

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::sendToAt
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination,Time sendTime)

{
  string_view string2;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view string1;
  anon_class_16_1_bc572e6e_for__M_pred __pred;
  string_view string3;
  bool bVar1;
  GlobalFederateId GVar2;
  pair<helics::route_id,_helics::ActionMessage> *M;
  undefined8 uVar3;
  FederateState *this_00;
  Time TVar4;
  SmallBuffer *this_01;
  long in_RDI;
  __sv_type _Var5;
  Time minTime;
  ActionMessage message;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  res;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *hndl;
  CommonCore *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar6;
  action_t in_stack_fffffffffffffdcc;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  char *in_stack_fffffffffffffdd8;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  in_stack_fffffffffffffde0;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  in_stack_fffffffffffffde8;
  FederateState *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  InterfaceHandle handle;
  ActionMessage *local_1f8;
  BrokerBase *pBStack_1f0;
  uint64_t in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  CommonCore *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  InterfaceHandle in_stack_ffffffffffffff64;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  handle.hid = (BaseType)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    TVar4.internalTimeCode._4_4_ = in_stack_ffffffffffffff5c;
    TVar4.internalTimeCode._0_4_ = in_stack_ffffffffffffff58;
    sendAt(in_stack_ffffffffffffff50,in_stack_ffffffffffffff64,in_stack_ffffffffffffff48,
           in_stack_ffffffffffffff40,TVar4);
  }
  else {
    M = getHandleInfo(in_stack_fffffffffffffda8,
                      (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    if (M == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      message_00._M_len._4_4_ = in_stack_fffffffffffffdcc;
      message_00._M_len._0_4_ = in_stack_fffffffffffffdc8;
      message_00._M_str._0_4_ = in_stack_fffffffffffffdd0;
      message_00._M_str._4_4_ = in_stack_fffffffffffffdd4;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffdc0,message_00);
      __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    if ((char)(M->second).messageID != 'e') {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      message_01._M_len._4_4_ = in_stack_fffffffffffffdcc;
      message_01._M_len._0_4_ = in_stack_fffffffffffffdc8;
      message_01._M_str._0_4_ = in_stack_fffffffffffffdd0;
      message_01._M_str._4_4_ = in_stack_fffffffffffffdd4;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffdc0,message_01);
      __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    this_00 = getFederateAt((CommonCore *)in_stack_fffffffffffffde8._M_current,
                            (LocalFederateId)(BaseType)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>(M,targeted_flag);
    if (bVar1) {
      in_stack_fffffffffffffde0._M_current =
           (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
           &stack0xffffffffffffff60;
      FederateState::getMessageDestinations(in_stack_fffffffffffffdf0,handle);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::begin((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)in_stack_fffffffffffffda8);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)in_stack_fffffffffffffda8);
      __pred.destination._M_len._4_4_ = in_stack_fffffffffffffdd4;
      __pred.destination._M_len._0_4_ = in_stack_fffffffffffffdd0;
      __pred.destination._M_str = in_stack_fffffffffffffdd8;
      in_stack_fffffffffffffde8 =
           std::
           find_if<__gnu_cxx::__normal_iterator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>*,std::vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>>,helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                     (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,__pred);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)in_stack_fffffffffffffda8);
      bVar1 = __gnu_cxx::
              operator==<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                        ((__normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffdb0,
                         (__normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffda8);
      if (bVar1) {
        uVar3 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        message_02._M_len._4_4_ = in_stack_fffffffffffffdcc;
        message_02._M_len._0_4_ = in_stack_fffffffffffffdc8;
        message_02._M_str._0_4_ = in_stack_fffffffffffffdd0;
        message_02._M_str._4_4_ = in_stack_fffffffffffffdd4;
        InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffdc0,message_02)
        ;
        __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::~vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)in_stack_fffffffffffffdc0);
    }
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdcc);
    std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0x540));
    GVar2 = BasicHandleInfo::getFederateId((BasicHandleInfo *)M);
    TVar4 = FederateState::nextAllowedSendTime(this_00);
    uVar6 = (undefined4)TVar4.internalTimeCode;
    uVar7 = (undefined4)((ulong)TVar4.internalTimeCode >> 0x20);
    this_01 = (SmallBuffer *)
              std::max<TimeRepresentation<count_time<9,long>>>
                        ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffda8,
                         (TimeRepresentation<count_time<9,_long>_> *)0x53dbf8);
    SmallBuffer::assign(this_01,in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdb0);
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdb0);
    local_1f8 = (ActionMessage *)_Var5._M_len;
    pBStack_1f0 = (BrokerBase *)_Var5._M_str;
    string1._M_len._4_4_ = uVar7;
    string1._M_len._0_4_ = uVar6;
    string1._M_str._0_4_ = in_stack_fffffffffffffdd0;
    string1._M_str._4_4_ = GVar2.gid;
    string2._M_str = (char *)this_01;
    string2._M_len = (size_t)in_stack_fffffffffffffdb8;
    string3._M_str = (char *)in_stack_fffffffffffffde8._M_current;
    string3._M_len = (size_t)in_stack_fffffffffffffde0._M_current;
    ActionMessage::setStringData((ActionMessage *)pBStack_1f0,string1,string2,string3);
    BrokerBase::addActionMessage(pBStack_1f0,local_1f8);
    ActionMessage::~ActionMessage((ActionMessage *)pBStack_1f0);
  }
  return;
}

Assistant:

void CommonCore::sendToAt(InterfaceHandle sourceHandle,
                          const void* data,
                          uint64_t length,
                          std::string_view destination,
                          Time sendTime)
{
    if (destination.empty()) {
        // sendToAt should be the equivalent of sendAt if there is an empty destination
        sendAt(sourceHandle, data, length, sendTime);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }

    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    auto minTime = fed->nextAllowedSendTime();
    message.actionTime = std::max(sendTime, minTime);
    message.flags = hndl->flags;

    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);

    addActionMessage(std::move(message));
}